

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum_max.hpp
# Opt level: O2

pair<int_*,_int>
burst::partial_sum_max<int*,int*,std::plus<void>,std::less<void>>
          (uint *first,uint *last,uint *result)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  pair<int_*,_int> pVar4;
  
  if (first == last) {
    uVar3 = 0;
  }
  else {
    uVar2 = *first;
    *result = uVar2;
    result = result + 1;
    uVar3 = (ulong)uVar2;
    for (first = first + 1; first != last; first = first + 1) {
      uVar1 = *first;
      if ((int)uVar3 <= (int)uVar1) {
        uVar3 = (ulong)uVar1;
      }
      uVar2 = uVar2 + uVar1;
      *result = uVar2;
      result = result + 1;
    }
  }
  pVar4._8_8_ = uVar3;
  pVar4.first = (int *)result;
  return pVar4;
}

Assistant:

std::pair<OutputIterator, iterator_value_t<InputIterator>>
        partial_sum_max
        (
            InputIterator first,
            InputIterator last,
            OutputIterator result,
            BinaryFunction plus,
            BinaryPredicate less
        )
    {
        if (first != last)
        {
            auto sum = *first;
            auto max = sum;

            *result = sum;

            while (++first != last)
            {
                auto current = *first;
                if (less(max, current))
                {
                    max = current;
                }

                auto new_sum = plus(std::move(sum), std::move(current));
                sum = std::move(new_sum);

                ++result;
                *result = sum;
            }

            return {++result, max};
        }

        return {result, iterator_value_t<InputIterator>{}};
    }